

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.hpp
# Opt level: O0

Widget * __thiscall cppurses::Widget::find_child<cppurses::Widget>(Widget *this,string *name)

{
  bool bVar1;
  __type _Var2;
  vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
  *this_00;
  pointer pWVar3;
  undefined1 local_60 [40];
  unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *widg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
  *__range2;
  string *name_local;
  Widget *this_local;
  
  this_00 = Children_data::get(&this->children);
  __end2 = std::
           vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ::begin(this_00);
  widg = (unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *)
         std::
         vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_*,_std::vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>_>
                                *)&widg);
    if (!bVar1) {
      return (Widget *)0x0;
    }
    local_60._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_*,_std::vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>_>
         ::operator*(&__end2);
    std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::operator->
              ((unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *)
               local_60._32_8_);
    name_abi_cxx11_((Widget *)local_60);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,name);
    bVar1 = false;
    if (_Var2) {
      pWVar3 = std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::get
                         ((unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *)
                          local_60._32_8_);
      bVar1 = pWVar3 != (pointer)0x0;
    }
    std::__cxx11::string::~string((string *)local_60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_*,_std::vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>_>
    ::operator++(&__end2);
  }
  pWVar3 = std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::get
                     ((unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *)
                      local_60._32_8_);
  return pWVar3;
}

Assistant:

Widg_t* find_child(const std::string& name) const
    {
        for (const std::unique_ptr<Widget>& widg : this->children.get()) {
            if (widg->name() == name &&
                dynamic_cast<Widg_t*>(widg.get()) != nullptr) {
                return widg.get();
            }
        }
        return nullptr;
    }